

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
::
~TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
          (TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
           *this)

{
  TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
  *this_local;
  
  ~TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
            (this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

TEST(SimpleStringInternalCache, clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory)
{
    cache.setAllocator(allocator);

    cache.alloc(1234);
    cache.alloc(1234);
    cache.alloc(1234);

    cache.clearAllIncludingCurrentlyUsedMemory();

    LONGS_EQUAL(3, accountant.totalAllocationsOfSize(1234));
    LONGS_EQUAL(3, accountant.totalDeallocationsOfSize(1234));
}